

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

void hwnet::TCPConnector::connectTimeout(Ptr *t,Ptr *self)

{
  Poller *this;
  Ptr *__a;
  bool bVar1;
  element_type *peVar2;
  byte local_4d;
  shared_ptr<hwnet::Task> local_40;
  shared_ptr<hwnet::util::Timer> local_30;
  byte local_19;
  Ptr *pPStack_18;
  bool post;
  Ptr *self_local;
  Ptr *t_local;
  
  local_19 = 0;
  pPStack_18 = self;
  self_local = (Ptr *)t;
  peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)self);
  std::mutex::lock(&peVar2->mtx);
  __a = self_local;
  std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             self);
  std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)&local_30);
  bVar1 = std::operator==((shared_ptr<hwnet::util::Timer> *)__a,&local_30);
  local_4d = 0;
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    local_4d = peVar2->doing ^ 0xff;
  }
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr(&local_30);
  if ((local_4d & 1) != 0) {
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(peVar2->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>);
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    peVar2->doing = true;
    local_19 = 1;
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    peVar2->gotError = true;
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    peVar2->err = 0x6e;
  }
  peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)self);
  std::mutex::unlock(&peVar2->mtx);
  if ((local_19 & 1) != 0) {
    peVar2 = std::__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)self);
    this = peVar2->poller_;
    std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPConnector,void>(&local_40,self);
    Poller::PostTask(this,&local_40,(ThreadPool *)0x0);
    std::shared_ptr<hwnet::Task>::~shared_ptr(&local_40);
  }
  return;
}

Assistant:

void TCPConnector::connectTimeout(const util::Timer::Ptr &t,TCPConnector::Ptr self) {
	auto post = false;
	self->mtx.lock();
	if(t == self->connectTimer.lock() && !self->doing){
		self->connectTimer.reset();
		self->doing = true;
		post = true;
		self->gotError = true;
		self->err = ETIMEDOUT;
	}
	self->mtx.unlock();
	if(post) {
		self->poller_->PostTask(self);
	}	
}